

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

RowSetEntry * rowSetEntrySort(RowSetEntry *pIn)

{
  RowSetEntry *pRVar1;
  long lVar2;
  ulong uVar3;
  RowSetEntry *pA;
  RowSetEntry **ppRVar4;
  RowSetEntry *aBucket [40];
  RowSetEntry *local_168 [40];
  
  memset(local_168,0,0x140);
  if (pIn != (RowSetEntry *)0x0) {
    do {
      pRVar1 = pIn->pRight;
      pIn->pRight = (RowSetEntry *)0x0;
      ppRVar4 = local_168;
      if (local_168[0] != (RowSetEntry *)0x0) {
        uVar3 = 1;
        pA = local_168[0];
        ppRVar4 = local_168;
        do {
          pIn = rowSetEntryMerge(pA,pIn);
          *ppRVar4 = (RowSetEntry *)0x0;
          ppRVar4 = local_168 + uVar3;
          pA = *ppRVar4;
          uVar3 = (ulong)((int)uVar3 + 1);
        } while (pA != (RowSetEntry *)0x0);
      }
      *ppRVar4 = pIn;
      pIn = pRVar1;
    } while (pRVar1 != (RowSetEntry *)0x0);
  }
  lVar2 = 0;
  pRVar1 = (RowSetEntry *)0x0;
  do {
    pRVar1 = rowSetEntryMerge(pRVar1,local_168[lVar2]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x28);
  return pRVar1;
}

Assistant:

static struct RowSetEntry *rowSetEntrySort(struct RowSetEntry *pIn){
  unsigned int i;
  struct RowSetEntry *pNext, *aBucket[40];

  memset(aBucket, 0, sizeof(aBucket));
  while( pIn ){
    pNext = pIn->pRight;
    pIn->pRight = 0;
    for(i=0; aBucket[i]; i++){
      pIn = rowSetEntryMerge(aBucket[i], pIn);
      aBucket[i] = 0;
    }
    aBucket[i] = pIn;
    pIn = pNext;
  }
  pIn = 0;
  for(i=0; i<sizeof(aBucket)/sizeof(aBucket[0]); i++){
    pIn = rowSetEntryMerge(pIn, aBucket[i]);
  }
  return pIn;
}